

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

Entry * __thiscall
Lib::DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>::
findEntry(DHMap<Kernel::Clause_*,_Lib::DArray<unsigned_int>_*,_Lib::DefaultHash,_Lib::DefaultHash2>
          *this,Clause **key)

{
  Entry *pEVar1;
  uint uVar2;
  uint uVar3;
  Clause *pCVar4;
  Entry *pEVar5;
  uint uVar6;
  size_t i;
  long lVar7;
  Entry *pEVar8;
  int iVar9;
  ulong uVar10;
  uint local_4;
  
  uVar2 = this->_capacity;
  local_4 = 0;
  pEVar8 = (Entry *)0x0;
  if (uVar2 != 0) {
    pCVar4 = *key;
    if (pCVar4 != (Clause *)0x0) {
      local_4 = (pCVar4->super_Unit)._number;
    }
    uVar6 = 0x811c9dc5;
    lVar7 = 0;
    do {
      uVar6 = (*(byte *)((long)&local_4 + lVar7) ^ uVar6) * 0x1000193;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    uVar10 = (ulong)uVar6 % (ulong)uVar2;
    pEVar5 = this->_entries;
    uVar6 = pEVar5[uVar10].field_0._infoData;
    uVar3 = this->_timestamp;
    pEVar8 = (Entry *)0x0;
    if (uVar6 >> 2 == uVar3) {
      if (pEVar5[uVar10]._key == pCVar4) {
        pEVar8 = (Entry *)0x0;
        if ((uVar6 & 1) == 0) {
          pEVar8 = pEVar5 + uVar10;
        }
      }
      else {
        pEVar8 = (Entry *)0x0;
        if ((uVar6 & 2) != 0) {
          if (pCVar4 != (Clause *)0x0) {
            pEVar8 = (Entry *)(ulong)(pCVar4->super_Unit)._number;
          }
          iVar9 = (int)((ulong)pEVar8 % (ulong)uVar2);
          do {
            uVar10 = (ulong)((int)uVar10 + iVar9 + (uint)(iVar9 == 0)) % (ulong)uVar2;
            pEVar1 = pEVar5 + uVar10;
            uVar6 = (uint)(pEVar1->field_0)._infoData >> 2;
            if (uVar6 != uVar3) break;
          } while (pEVar1->_key != pCVar4);
          pEVar8 = (Entry *)0x0;
          if (((pEVar1->field_0)._infoData & 1U) == 0 && uVar6 == uVar3) {
            pEVar8 = pEVar1;
          }
        }
      }
    }
  }
  return pEVar8;
}

Assistant:

const Entry* findEntry(Key const& key) const
  {
    if (_capacity == 0) return nullptr;
    ASS(_capacity>_size+_deleted);

    unsigned h1=Hash1::hash(key);
    unsigned pos=h1%_capacity;
    Entry* res=&_entries[pos];
    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }
    if(res->_key==key) {
      return res->_info.deleted ? 0 : res;
    }

    //We have a collision...

    if(!res->_info.collision) {
      //There were no collisions on this position during inserting,
      //so the key we're searching for isn't here anyway
      return 0;
    }

    unsigned h2=Hash2::hash(key)%_capacity;
    if(h2==0) {
      h2=1;
    }
    do {
      pos=(pos+h2)%_capacity;
      res=&_entries[pos];
    } while (res->_info.timestamp == _timestamp && res->_key!=key);

    if(res->_info.timestamp != _timestamp ) {
      return 0;
    }

    ASS(res->_key==key);
    return res->_info.deleted ? 0 : res;
  }